

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsWriter.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::MhsWriter::MhsWriter(MhsWriter *this,IO *io,string *name,Mode mode,Comm *comm)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  pointer *pppIVar3;
  pointer *pppEVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var6;
  ADIOS *this_00;
  iterator __position;
  pointer pcVar7;
  iterator __position_00;
  uint uVar8;
  int iVar9;
  uint uVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  long *plVar13;
  undefined8 *puVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  uint uVar17;
  undefined8 uVar18;
  uint __val;
  IO *pIVar19;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  string __str;
  string local_128;
  string local_108;
  string local_e8;
  Comm local_c8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_c0;
  vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *local_b8;
  vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *local_b0;
  int *local_a8;
  IO *local_a0;
  undefined1 local_98 [32];
  Params *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MhsWriter","");
  helper::Comm::Comm(&local_c8,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&local_c8);
  helper::Comm::~Comm(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsWriter_00887a68;
  local_b0 = (vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)&this->m_SubIOs;
  local_b8 = (vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)
             &this->m_SubEngines;
  local_c0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->m_TransportMap;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_TransportMap)._M_h._M_buckets = &(this->m_TransportMap)._M_h._M_single_bucket;
  (this->m_TransportMap)._M_h._M_bucket_count = 1;
  (this->m_TransportMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_TransportMap)._M_h._M_element_count = 0;
  (this->m_TransportMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_TransportMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_TransportMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_Tiers = 1;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Tiers","");
  local_a8 = &this->m_Tiers;
  local_78 = &io->m_Parameters;
  helper::GetParameter<int>(local_78,&local_128,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  this_01 = &((io->m_TransportsParameters).
              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var6 = &((io->m_TransportsParameters).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  local_a0 = io;
  if (this_01 != p_Var6) {
    do {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"variable","");
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(this_01,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      p_Var1 = &(this_01->_M_impl).super__Rb_tree_header;
      if (p_Var1 != (_Rb_tree_header *)cVar11._M_node) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"transport","");
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(this_01,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if (p_Var1 != (_Rb_tree_header *)cVar12._M_node) {
          iVar9 = std::__cxx11::string::compare((char *)(cVar12._M_node + 2));
          if (iVar9 == 0) {
            local_128._M_dataplus._M_p = (pointer)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<adios2::core::compress::CompressSirius,std::allocator<adios2::core::compress::CompressSirius>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                       (CompressSirius **)&local_128,
                       (allocator<adios2::core::compress::CompressSirius> *)&local_108,local_78);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::__cxx11::string_const&,std::shared_ptr<adios2::core::compress::CompressSirius>>
                      (local_c0,cVar11._M_node + 2,&local_128);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length)
              ;
            }
          }
          else {
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Engine","");
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"MhsWriter","");
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MhsWriter","");
            local_98._0_8_ = local_98 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_98,"invalid operator","");
            helper::Throw<std::invalid_argument>
                      (&local_128,&local_108,&local_e8,(string *)local_98,-1);
            if ((Engine *)local_98._0_8_ != (Engine *)(local_98 + 0x10)) {
              operator_delete((void *)local_98._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
          }
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != p_Var6);
  }
  if (0 < *local_a8) {
    __val = 0;
    pIVar19 = local_a0;
    do {
      uVar17 = 1;
      if (9 < __val) {
        uVar15 = (ulong)__val;
        uVar8 = 4;
        do {
          uVar17 = uVar8;
          uVar10 = (uint)uVar15;
          if (uVar10 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_006ccc73;
          }
          if (uVar10 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_006ccc73;
          }
          if (uVar10 < 10000) goto LAB_006ccc73;
          uVar15 = uVar15 / 10000;
          uVar8 = uVar17 + 4;
        } while (99999 < uVar10);
        uVar17 = uVar17 + 1;
      }
LAB_006ccc73:
      this_00 = pIVar19->m_ADIOS;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_128,(char)uVar17);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_128._M_dataplus._M_p,uVar17,__val);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x767414);
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 == paVar16) {
        local_60._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_60._8_8_ = plVar13[3];
        local_70._M_allocated_capacity = (size_type)&local_60;
      }
      else {
        local_60._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_70._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar13;
      }
      paVar5 = &local_128.field_2;
      local_70._8_8_ = plVar13[1];
      *plVar13 = (long)paVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_108._M_dataplus._M_p = (pointer)ADIOS::DeclareIO(this_00,(string *)&local_70,Auto);
      __position._M_current =
           (this->m_SubIOs).
           super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_SubIOs).
          super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
        _M_realloc_insert<adios2::core::IO*>(local_b0,__position,(IO **)&local_108);
      }
      else {
        *__position._M_current = (IO *)local_108._M_dataplus._M_p;
        pppIVar3 = &(this->m_SubIOs).
                    super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppIVar3 = *pppIVar3 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity != &local_60) {
        operator_delete((void *)local_70._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar5) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      pIVar19 = (this->m_SubIOs).
                super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      pcVar7 = (this->super_Engine).m_Name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar7,pcVar7 + (this->super_Engine).m_Name._M_string_length);
      std::__cxx11::string::append((char *)&local_108);
      uVar17 = 1;
      if (9 < __val) {
        uVar15 = (ulong)__val;
        uVar8 = 4;
        do {
          uVar17 = uVar8;
          uVar10 = (uint)uVar15;
          if (uVar10 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_006cce13;
          }
          if (uVar10 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_006cce13;
          }
          if (uVar10 < 10000) goto LAB_006cce13;
          uVar15 = uVar15 / 10000;
          uVar8 = uVar17 + 4;
        } while (99999 < uVar10);
        uVar17 = uVar17 + 1;
      }
LAB_006cce13:
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_e8,(char)uVar17);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_e8._M_dataplus._M_p,uVar17,__val);
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar18 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_e8._M_string_length + local_108._M_string_length) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          uVar18 = local_e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_e8._M_string_length + local_108._M_string_length)
        goto LAB_006cce84;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_e8,0,(char *)0x0,(ulong)local_108._M_dataplus._M_p);
      }
      else {
LAB_006cce84:
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_108,(ulong)local_e8._M_dataplus._M_p);
      }
      psVar2 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_128.field_2._M_allocated_capacity = *psVar2;
        local_128.field_2._8_8_ = puVar14[3];
        local_128._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar2;
        local_128._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_128._M_string_length = puVar14[1];
      *puVar14 = psVar2;
      puVar14[1] = 0;
      *(undefined1 *)psVar2 = 0;
      local_98._0_8_ = IO::Open(pIVar19,&local_128,Write);
      pIVar19 = local_a0;
      __position_00._M_current =
           (this->m_SubEngines).
           super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_SubEngines).
          super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
        _M_realloc_insert<adios2::core::Engine*>(local_b8,__position_00,(Engine **)local_98);
      }
      else {
        *__position_00._M_current = (Engine *)local_98._0_8_;
        pppEVar4 = &(this->m_SubEngines).
                    super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar4 = *pppEVar4 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar5) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      __val = __val + 1;
    } while ((int)__val < *local_a8);
  }
  (this->super_Engine).m_IsOpen = true;
  return;
}

Assistant:

MhsWriter::MhsWriter(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("MhsWriter", io, name, mode, std::move(comm))
{
    helper::GetParameter(io.m_Parameters, "Tiers", m_Tiers);
    for (const auto &transportParams : io.m_TransportsParameters)
    {
        auto itVar = transportParams.find("variable");
        if (itVar == transportParams.end())
        {
            continue;
        }
        auto itTransport = transportParams.find("transport");
        if (itTransport == transportParams.end())
        {
            continue;
        }

        if (itTransport->second == "sirius")
        {
            m_TransportMap.emplace(itVar->second,
                                   std::make_shared<compress::CompressSirius>(io.m_Parameters));
        }
        else
        {
            helper::Throw<std::invalid_argument>("Engine", "MhsWriter", "MhsWriter",
                                                 "invalid operator");
        }
    }
    for (int i = 0; i < m_Tiers; ++i)
    {
        m_SubIOs.emplace_back(&io.m_ADIOS.DeclareIO("SubIO" + std::to_string(i)));
        m_SubEngines.emplace_back(
            &m_SubIOs.back()->Open(m_Name + ".tier" + std::to_string(i), adios2::Mode::Write));
    }
    m_IsOpen = true;
}